

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O2

void slide(char *r,uint8_t *a)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  
  for (uVar2 = 0; uVar2 != 0x100; uVar2 = uVar2 + 1) {
    r[uVar2] = (a[uVar2 >> 3 & 0x1fffffff] >> ((uint)uVar2 & 7) & 1) != 0;
  }
  lVar4 = 0;
  uVar2 = 1;
  while( true ) {
    if (lVar4 == 0x100) {
      return;
    }
    if (r[lVar4] != '\0') break;
LAB_00179da4:
    lVar4 = lVar4 + 1;
    uVar2 = uVar2 + 1;
  }
  uVar3 = 1;
  uVar5 = uVar2;
  do {
    if ((6 < uVar3) || (uVar6 = uVar3 + lVar4, 0xff < uVar6)) goto LAB_00179da4;
    if (r[uVar6] != '\0') {
      iVar7 = (int)r[uVar6] << ((byte)uVar3 & 0x1f);
      iVar1 = iVar7 + r[lVar4];
      if (iVar1 < 0x10) {
        r[lVar4] = (char)iVar1;
        r[uVar6] = '\0';
      }
      else {
        iVar7 = r[lVar4] - iVar7;
        if (iVar7 < -0xf) goto LAB_00179da4;
        r[lVar4] = (char)iVar7;
        for (uVar6 = uVar5; uVar6 < 0x100; uVar6 = uVar6 + 1) {
          if (r[uVar6] == '\0') {
            r[uVar6] = '\x01';
            break;
          }
          r[uVar6] = '\0';
        }
      }
    }
    uVar3 = uVar3 + 1;
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

static void slide(signed char *r, const uint8_t *a) {
  int i;
  int b;
  int k;

  for (i = 0; i < 256; ++i) {
    r[i] = 1 & (a[i >> 3] >> (i & 7));
  }

  for (i = 0; i < 256; ++i) {
    if (r[i]) {
      for (b = 1; b <= 6 && i + b < 256; ++b) {
        if (r[i + b]) {
          if (r[i] + (r[i + b] << b) <= 15) {
            r[i] += r[i + b] << b;
            r[i + b] = 0;
          } else if (r[i] - (r[i + b] << b) >= -15) {
            r[i] -= r[i + b] << b;
            for (k = i + b; k < 256; ++k) {
              if (!r[k]) {
                r[k] = 1;
                break;
              }
              r[k] = 0;
            }
          } else {
            break;
          }
        }
      }
    }
  }
}